

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

void __thiscall
vkt::QueryPool::anon_unknown_0::GraphicBasicTestInstance::GraphicBasicTestInstance
          (GraphicBasicTestInstance *this,Context *context,
          vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
          *data,ParametersGraphic *parametersGraphic)

{
  ParametersGraphic *parametersGraphic_local;
  vector<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData,_std::allocator<vkt::QueryPool::(anonymous_namespace)::GraphicBasicTestInstance::VertexData>_>
  *data_local;
  Context *context_local;
  GraphicBasicTestInstance *this_local;
  
  StatisticQueryTestInstance::StatisticQueryTestInstance
            (&this->super_StatisticQueryTestInstance,context);
  (this->super_StatisticQueryTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__GraphicBasicTestInstance_016ad200;
  this->m_colorAttachmentFormat = VK_FORMAT_R8G8B8A8_UNORM;
  de::SharedPtr<vkt::Draw::Image>::SharedPtr(&this->m_colorAttachmentImage);
  de::SharedPtr<vkt::Draw::Image>::SharedPtr(&this->m_depthImage);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_attachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_depthiew);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(&this->m_framebuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(&this->m_pipeline);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  this->m_data = data;
  this->m_parametersGraphic = parametersGraphic;
  return;
}

Assistant:

GraphicBasicTestInstance::GraphicBasicTestInstance (vkt::Context&					context,
													const std::vector<VertexData>&	data,
													const ParametersGraphic&		parametersGraphic)
	: StatisticQueryTestInstance	(context)
	, m_colorAttachmentFormat		(VK_FORMAT_R8G8B8A8_UNORM)
	, m_data						(data)
	, m_parametersGraphic			(parametersGraphic)
{
}